

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HebrewCalendar.cpp
# Opt level: O2

void __thiscall HebrewCalendar::HebrewCalendar(HebrewCalendar *this,int d)

{
  int iVar1;
  int iVar2;
  int month;
  int iVar3;
  HebrewCalendar local_48;
  
  (this->super_Calendar).month = 1;
  (this->super_Calendar).day = 1;
  (this->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00104d90;
  iVar3 = (d + -0x14f4f5) / 0x16e + -1;
  do {
    local_48.super_Calendar.year = iVar3 + 2;
    local_48.super_Calendar.month = 7;
    local_48.super_Calendar.day = 1;
    local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00104d90;
    iVar1 = operator_cast_to_int(&local_48);
    iVar3 = iVar3 + 1;
  } while (iVar1 <= d);
  (this->super_Calendar).year = iVar3;
  local_48.super_Calendar.month = 1;
  local_48.super_Calendar.day = 1;
  local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00104d90;
  local_48.super_Calendar.year = iVar3;
  iVar2 = operator_cast_to_int(&local_48);
  iVar1 = 1;
  if (d < iVar2) {
    iVar1 = 7;
  }
  do {
    month = iVar1;
    local_48.super_Calendar.day = LastMonthDay(this,month,iVar3);
    local_48.super_Calendar.month = month;
    local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00104d90;
    local_48.super_Calendar.year = iVar3;
    iVar2 = operator_cast_to_int(&local_48);
    iVar1 = month + 1;
  } while (iVar2 < d);
  (this->super_Calendar).month = month;
  local_48.super_Calendar.day = 1;
  local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00104d90;
  local_48.super_Calendar.year = iVar3;
  iVar3 = operator_cast_to_int(&local_48);
  (this->super_Calendar).day = (d - iVar3) + 1;
  return;
}

Assistant:

HebrewCalendar::HebrewCalendar(int d) { // Computes the HebrewCalendar date from the absolute date.
    year = (d + HebrewEpoch) / 366; // Approximation from below.
    // Search forward for year from the approximation.
    while (d >= HebrewCalendar(7, 1, year + 1))
        year++;
    // Search forward for month from either Tishri or Nisan.
    if (d < HebrewCalendar(1, 1, year))
        month = 7;  //  Start at Tishri
    else
        month = 1;  //  Start at Nisan
    while (d > HebrewCalendar(month, (LastMonthDay(month, year)), year))
        month++;
    // Calculate the day by subtraction.
    day = d - HebrewCalendar(month, 1, year) + 1;
}